

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::dumpDOT(CFG *this,string *fileName)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  allocator local_239;
  string local_238;
  ofstream fout;
  
  std::ofstream::ofstream(&fout,(string *)fileName,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    toDOT_abi_cxx11_(&local_238,this);
    std::operator<<((ostream *)&fout,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::ofstream::close();
    std::ofstream::~ofstream(&fout);
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_238,"Unable to write file: ",&local_239);
  std::operator+(__return_storage_ptr__,&local_238,fileName);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void CFG::dumpDOT(const std::string& fileName) {
	std::ofstream fout(fileName);
	if (!fout.is_open())
		throw std::string("Unable to write file: ") + fileName;

	fout << this->toDOT();
	fout.close();
}